

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

void __thiscall
duckdb::DatabaseInstance::Configure(DatabaseInstance *this,DBConfig *new_config,char *database_path)

{
  DBConfig *this_00;
  case_insensitive_map_t<ExtensionOption> *this_01;
  _Rb_tree_header *p_Var1;
  DBConfigOptions *this_02;
  unique_ptr<duckdb::Allocator,_std::default_delete<duckdb::Allocator>,_true> *this_03;
  unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>,_true> *this_04;
  char *pcVar2;
  _Head_base<0UL,_duckdb::SecretManager_*,_false> _Var3;
  _Head_base<0UL,_duckdb::SecretManager_*,_false> _Var4;
  _Head_base<0UL,_duckdb::Allocator_*,_false> __p_00;
  _Head_base<0UL,_duckdb::ErrorManager_*,_false> __p_01;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  pointer pRVar7;
  pointer pPVar8;
  element_type *peVar9;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psVar10;
  undefined8 uVar11;
  element_type *peVar12;
  pointer __p;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> _Var13;
  size_t sVar14;
  long *plVar15;
  type fs;
  idx_t iVar16;
  Allocator *this_05;
  pointer __p_02;
  shared_ptr<duckdb::Allocator,_true> *other;
  long *plVar17;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> _Var18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  BufferPool *__tmp_1;
  string local_98;
  Value local_78;
  
  this_00 = &this->config;
  this_02 = &(this->config).options;
  DBConfigOptions::operator=(this_02,&new_config->options);
  if ((this->config).options.duckdb_api._M_string_length == 0) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"duckdb_api","");
    Value::Value(&local_78,"cpp");
    DBConfig::SetOptionByName(this_00,&local_98,&local_78);
    Value::~Value(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  if (database_path == (char *)0x0) {
    (this->config).options.database_path._M_string_length = 0;
    *(this->config).options.database_path._M_dataplus._M_p = '\0';
  }
  else {
    pcVar2 = (char *)(this->config).options.database_path._M_string_length;
    strlen(database_path);
    ::std::__cxx11::string::_M_replace((ulong)this_02,0,pcVar2,(ulong)database_path);
  }
  if ((new_config->options).temporary_directory._M_string_length == 0) {
    DBConfig::SetDefaultTempDirectory(this_00);
  }
  if ((this->config).options.access_mode == UNDEFINED) {
    (this->config).options.access_mode = READ_WRITE;
  }
  this_01 = &(this->config).extension_parameters;
  if (&new_config->extension_parameters != this_01) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::ExtensionOption>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::ExtensionOption>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::ExtensionOption>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::ExtensionOption>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::ExtensionOption>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::ExtensionOption>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_01,&(new_config->extension_parameters)._M_h);
  }
  _Var13._M_head_impl =
       (new_config->file_system).
       super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
       super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
       super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl;
  if (_Var13._M_head_impl == (FileSystem *)0x0) {
    _Var13._M_head_impl = (FileSystem *)operator_new(0x90);
    VirtualFileSystem::VirtualFileSystem((VirtualFileSystem *)_Var13._M_head_impl);
    _Var18._M_head_impl =
         (this->config).file_system.
         super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
         super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
         super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl;
    (this->config).file_system.
    super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
    super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
    super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl = _Var13._M_head_impl;
  }
  else {
    (new_config->file_system).
    super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
    super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
    super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl = (FileSystem *)0x0;
    _Var18._M_head_impl =
         (this->config).file_system.
         super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
         super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
         super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl;
    (this->config).file_system.
    super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
    super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
    super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl = _Var13._M_head_impl;
  }
  if (_Var18._M_head_impl != (FileSystem *)0x0) {
    (*(_Var18._M_head_impl)->_vptr_FileSystem[1])();
  }
  if ((database_path != (char *)0x0) && ((this->config).options.enable_external_access == false)) {
    psVar10 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
              &local_78.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_78.type_._0_8_ = psVar10;
    sVar14 = strlen(database_path);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,database_path,database_path + sVar14);
    DBConfig::AddAllowedPath(this_00,(string *)&local_78);
    if ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_78.type_._0_8_ != psVar10) {
      operator_delete((void *)local_78.type_._0_8_);
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,".wal","");
    strlen(database_path);
    plVar15 = (long *)::std::__cxx11::string::replace
                                ((ulong)&local_98,0,(char *)0x0,(ulong)database_path);
    plVar17 = plVar15 + 2;
    if ((long *)*plVar15 == plVar17) {
      local_78.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar17;
      local_78._24_8_ = plVar15[3];
      local_78.type_._0_8_ = psVar10;
    }
    else {
      local_78.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar17;
      local_78.type_._0_8_ = (long *)*plVar15;
    }
    local_78.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)plVar15[1];
    *plVar15 = (long)plVar17;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    DBConfig::AddAllowedPath(this_00,(string *)&local_78);
    if ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_78.type_._0_8_ != psVar10) {
      operator_delete((void *)local_78.type_._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((this->config).options.temporary_directory._M_string_length != 0) {
      DBConfig::AddAllowedDirectory(this_00,&(this->config).options.temporary_directory);
    }
  }
  _Var3._M_head_impl =
       (new_config->secret_manager).
       super_unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>._M_t.
       super___uniq_ptr_impl<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::SecretManager_*,_std::default_delete<duckdb::SecretManager>_>.
       super__Head_base<0UL,_duckdb::SecretManager_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (SecretManager *)0x0) {
    (new_config->secret_manager).
    super_unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SecretManager_*,_std::default_delete<duckdb::SecretManager>_>.
    super__Head_base<0UL,_duckdb::SecretManager_*,_false>._M_head_impl = (SecretManager *)0x0;
    _Var4._M_head_impl =
         (this->config).secret_manager.
         super_unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>._M_t.
         super___uniq_ptr_impl<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::SecretManager_*,_std::default_delete<duckdb::SecretManager>_>
         .super__Head_base<0UL,_duckdb::SecretManager_*,_false>._M_head_impl;
    (this->config).secret_manager.
    super_unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SecretManager_*,_std::default_delete<duckdb::SecretManager>_>.
    super__Head_base<0UL,_duckdb::SecretManager_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var4._M_head_impl != (SecretManager *)0x0) {
      (**(code **)((long)(_Var4._M_head_impl)->_vptr_SecretManager + 8))();
    }
  }
  if ((this->config).options.maximum_memory == 0xffffffffffffffff) {
    DBConfig::SetDefaultMaxMemory(this_00);
  }
  if ((new_config->options).maximum_threads == 0xffffffffffffffff) {
    fs = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator*
                   (&(this->config).file_system);
    iVar16 = DBConfig::GetSystemMaxThreads(fs);
    (this->config).options.maximum_threads = iVar16;
  }
  this_03 = &(this->config).allocator;
  __p_00._M_head_impl =
       (new_config->allocator).
       super_unique_ptr<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>._M_t.
       super___uniq_ptr_impl<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Allocator_*,_std::default_delete<duckdb::Allocator>_>.
       super__Head_base<0UL,_duckdb::Allocator_*,_false>._M_head_impl;
  (new_config->allocator).
  super_unique_ptr<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>._M_t.
  super___uniq_ptr_impl<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Allocator_*,_std::default_delete<duckdb::Allocator>_>.
  super__Head_base<0UL,_duckdb::Allocator_*,_false>._M_head_impl = (Allocator *)0x0;
  ::std::__uniq_ptr_impl<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>::reset
            ((__uniq_ptr_impl<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_> *)this_03,
             __p_00._M_head_impl);
  if ((this->config).allocator.
      super_unique_ptr<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>._M_t.
      super___uniq_ptr_impl<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Allocator_*,_std::default_delete<duckdb::Allocator>_>.
      super__Head_base<0UL,_duckdb::Allocator_*,_false>._M_head_impl == (Allocator *)0x0) {
    this_05 = (Allocator *)operator_new(0x20);
    Allocator::Allocator(this_05);
    ::std::__uniq_ptr_impl<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>::reset
              ((__uniq_ptr_impl<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_> *)
               this_03,this_05);
  }
  local_78.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (this->config).replacement_scans.
       super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
       super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  pRVar7 = (new_config->replacement_scans).
           super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
           super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_78.type_._0_8_ =
       (this->config).replacement_scans.
       super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
       super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_78.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (this->config).replacement_scans.
       super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
       super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (this->config).replacement_scans.
  super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
  super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl.
  super__Vector_impl_data._M_start =
       (new_config->replacement_scans).
       super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
       super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->config).replacement_scans.
  super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
  super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar7;
  (this->config).replacement_scans.
  super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
  super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (new_config->replacement_scans).
       super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
       super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (new_config->replacement_scans).
  super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
  super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (new_config->replacement_scans).
  super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
  super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (new_config->replacement_scans).
  super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
  super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>::~vector
            ((vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_> *)&local_78)
  ;
  local_78.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (this->config).parser_extensions.
       super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>.
       super__Vector_base<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  pPVar8 = (new_config->parser_extensions).
           super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>.
           super__Vector_base<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_78.type_._0_8_ =
       (this->config).parser_extensions.
       super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>.
       super__Vector_base<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_78.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (this->config).parser_extensions.
       super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>.
       super__Vector_base<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (this->config).parser_extensions.
  super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>.
  super__Vector_base<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>._M_impl.
  super__Vector_impl_data._M_start =
       (new_config->parser_extensions).
       super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>.
       super__Vector_base<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->config).parser_extensions.
  super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>.
  super__Vector_base<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar8;
  (this->config).parser_extensions.
  super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>.
  super__Vector_base<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (new_config->parser_extensions).
       super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>.
       super__Vector_base<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (new_config->parser_extensions).
  super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>.
  super__Vector_base<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (new_config->parser_extensions).
  super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>.
  super__Vector_base<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (new_config->parser_extensions).
  super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>.
  super__Vector_base<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>::~vector
            ((vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_> *)&local_78)
  ;
  this_04 = &(this->config).error_manager;
  __p_01._M_head_impl =
       (new_config->error_manager).
       super_unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>._M_t.
       super___uniq_ptr_impl<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::ErrorManager_*,_std::default_delete<duckdb::ErrorManager>_>.
       super__Head_base<0UL,_duckdb::ErrorManager_*,_false>._M_head_impl;
  (new_config->error_manager).
  super_unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ErrorManager_*,_std::default_delete<duckdb::ErrorManager>_>.
  super__Head_base<0UL,_duckdb::ErrorManager_*,_false>._M_head_impl = (ErrorManager *)0x0;
  ::std::__uniq_ptr_impl<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>::reset
            ((__uniq_ptr_impl<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_> *)
             this_04,__p_01._M_head_impl);
  if ((this->config).error_manager.
      super_unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>._M_t.
      super___uniq_ptr_impl<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ErrorManager_*,_std::default_delete<duckdb::ErrorManager>_>.
      super__Head_base<0UL,_duckdb::ErrorManager_*,_false>._M_head_impl == (ErrorManager *)0x0) {
    __p_02 = (pointer)operator_new(0x30);
    p_Var1 = &(__p_02->custom_errors)._M_t._M_impl.super__Rb_tree_header;
    (__p_02->custom_errors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p_02->custom_errors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    *(undefined8 *)&(__p_02->custom_errors)._M_t._M_impl = 0;
    *(undefined8 *)&(__p_02->custom_errors)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (__p_02->custom_errors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__p_02->custom_errors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__p_02->custom_errors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    ::std::__uniq_ptr_impl<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>::reset
              ((__uniq_ptr_impl<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_> *)
               this_04,__p_02);
  }
  if ((this->config).default_allocator.internal.
      super___shared_ptr<duckdb::Allocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    other = Allocator::DefaultAllocatorReference();
    shared_ptr<duckdb::Allocator,_true>::operator=(&(this->config).default_allocator,other);
  }
  peVar5 = (new_config->buffer_pool).internal.
           super___shared_ptr<duckdb::BufferPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar5 != (element_type *)0x0) {
    p_Var6 = (new_config->buffer_pool).internal.
             super___shared_ptr<duckdb::BufferPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (new_config->buffer_pool).internal.
    super___shared_ptr<duckdb::BufferPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (new_config->buffer_pool).internal.
    super___shared_ptr<duckdb::BufferPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->config).buffer_pool.internal.
    super___shared_ptr<duckdb::BufferPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    p_Var19 = (this->config).buffer_pool.internal.
              super___shared_ptr<duckdb::BufferPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->config).buffer_pool.internal.
    super___shared_ptr<duckdb::BufferPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var6;
    goto LAB_00fae5dd;
  }
  local_78.type_._0_8_ = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::BufferPool,std::allocator<duckdb::BufferPool>,unsigned_long&,bool&,unsigned_long&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.type_.type_info_,
             (BufferPool **)&local_78,(allocator<duckdb::BufferPool> *)&local_98,
             &(this->config).options.maximum_memory,
             &(this->config).options.buffer_manager_track_eviction_timestamps,
             &(this->config).options.allocator_bulk_deallocation_flush_threshold);
  peVar12 = local_78.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar11 = local_78.type_._0_8_;
  if (local_78.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_78.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type
           = *(int *)&(local_78.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->type + 1;
      UNLOCK();
      if (local_78.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) goto LAB_00fae5c8;
    }
    else {
      *(int *)&(local_78.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type
           = *(int *)&(local_78.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->type + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_78.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
LAB_00fae5c8:
  (this->config).buffer_pool.internal.
  super___shared_ptr<duckdb::BufferPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar11
  ;
  p_Var19 = (this->config).buffer_pool.internal.
            super___shared_ptr<duckdb::BufferPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->config).buffer_pool.internal.
  super___shared_ptr<duckdb::BufferPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar12;
LAB_00fae5dd:
  if (p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var19);
  }
  peVar9 = (new_config->db_cache_entry).internal.
           super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = (new_config->db_cache_entry).internal.
           super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (new_config->db_cache_entry).internal.
  super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (new_config->db_cache_entry).internal.
  super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var19 = (this->config).db_cache_entry.internal.
            super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->config).db_cache_entry.internal.
  super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar9;
  (this->config).db_cache_entry.internal.
  super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var6;
  if (p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var19);
  }
  return;
}

Assistant:

void DatabaseInstance::Configure(DBConfig &new_config, const char *database_path) {
	config.options = new_config.options;

	if (config.options.duckdb_api.empty()) {
		config.SetOptionByName("duckdb_api", "cpp");
	}

	if (database_path) {
		config.options.database_path = database_path;
	} else {
		config.options.database_path.clear();
	}

	if (new_config.options.temporary_directory.empty()) {
		config.SetDefaultTempDirectory();
	}

	if (config.options.access_mode == AccessMode::UNDEFINED) {
		config.options.access_mode = AccessMode::READ_WRITE;
	}
	config.extension_parameters = new_config.extension_parameters;
	if (new_config.file_system) {
		config.file_system = std::move(new_config.file_system);
	} else {
		config.file_system = make_uniq<VirtualFileSystem>();
	}
	if (database_path && !config.options.enable_external_access) {
		config.AddAllowedPath(database_path);
		config.AddAllowedPath(database_path + string(".wal"));
		if (!config.options.temporary_directory.empty()) {
			config.AddAllowedDirectory(config.options.temporary_directory);
		}
	}
	if (new_config.secret_manager) {
		config.secret_manager = std::move(new_config.secret_manager);
	}
	if (config.options.maximum_memory == DConstants::INVALID_INDEX) {
		config.SetDefaultMaxMemory();
	}
	if (new_config.options.maximum_threads == DConstants::INVALID_INDEX) {
		config.options.maximum_threads = config.GetSystemMaxThreads(*config.file_system);
	}
	config.allocator = std::move(new_config.allocator);
	if (!config.allocator) {
		config.allocator = make_uniq<Allocator>();
	}
	config.replacement_scans = std::move(new_config.replacement_scans);
	config.parser_extensions = std::move(new_config.parser_extensions);
	config.error_manager = std::move(new_config.error_manager);
	if (!config.error_manager) {
		config.error_manager = make_uniq<ErrorManager>();
	}
	if (!config.default_allocator) {
		config.default_allocator = Allocator::DefaultAllocatorReference();
	}
	if (new_config.buffer_pool) {
		config.buffer_pool = std::move(new_config.buffer_pool);
	} else {
		config.buffer_pool = make_shared_ptr<BufferPool>(config.options.maximum_memory,
		                                                 config.options.buffer_manager_track_eviction_timestamps,
		                                                 config.options.allocator_bulk_deallocation_flush_threshold);
	}
	config.db_cache_entry = std::move(new_config.db_cache_entry);
}